

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbox.cpp
# Opt level: O2

void __thiscall ftxui::DBox::SetBox(DBox *this,Box box)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<ftxui::Node> *child;
  pointer psVar3;
  
  Node::SetBox(&this->super_Node,box);
  psVar1 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->super_Node).children_.
                super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_Node[3])(peVar2,box._0_8_,box._8_8_);
  }
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    for (auto& child : children_)
      child->SetBox(box);
  }